

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

void pay_for_damage(char *dmgstr,boolean cant_mollify)

{
  char y_00;
  boolean bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  monst *mtmp;
  char *pcVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  uint damage_distance;
  uint shk_distance;
  monst *tmp_shk;
  char *shp;
  uint local_a0;
  int picks;
  uint nearest_damage;
  uint nearest_shk;
  long cost_of_damage;
  damage *appear_here;
  damage *tmp_dam;
  char local_78 [5];
  boolean dugwall;
  xchar y;
  xchar x;
  char qbuf [80];
  boolean uinshp;
  monst *pmStack_20;
  char shops_affected [5];
  monst *shkp;
  boolean cant_mollify_local;
  char *dmgstr_local;
  
  pmStack_20 = (monst *)0x0;
  qbuf[0x4a] = u.ushops[0] != '\0';
  iVar3 = strcmp(dmgstr,"dig into");
  bVar7 = true;
  if (iVar3 != 0) {
    iVar3 = strcmp(dmgstr,"damage");
    bVar7 = iVar3 == 0;
  }
  cost_of_damage = 0;
  _nearest_damage = 0;
  picks = 7000;
  local_a0 = 7000;
  shp._4_4_ = 0;
  appear_here = level->damagelist;
  while( true ) {
    bVar8 = false;
    if (appear_here != (damage *)0x0) {
      bVar8 = appear_here->when == (ulong)moves;
    }
    if (!bVar8) break;
    if (appear_here->cost != 0) {
      _nearest_damage = appear_here->cost + _nearest_damage;
      pcVar5 = in_rooms(level,(appear_here->place).x,(appear_here->place).y,0x12);
      strcpy(qbuf + 0x4b,pcVar5);
      for (tmp_shk = (monst *)(qbuf + 0x4b); *(char *)&tmp_shk->nmon != '\0';
          tmp_shk = (monst *)((long)&tmp_shk->nmon + 1)) {
        mtmp = shop_keeper(level,*(char *)&tmp_shk->nmon);
        if (mtmp != (monst *)0x0) {
          if (mtmp == pmStack_20) {
            uVar4 = dist2((int)(appear_here->place).x,(int)(appear_here->place).y,(int)u.ux,
                          (int)u.uy);
            if (uVar4 < local_a0) {
              cost_of_damage = (long)appear_here;
              local_a0 = uVar4;
            }
          }
          else {
            iVar3 = inhishop(mtmp);
            if ((iVar3 != 0) &&
               (uVar4 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), uVar4 <= (uint)picks
               )) {
              if ((uVar4 == picks) && (shp._4_4_ != 0)) {
                shp._4_4_ = shp._4_4_ + 1;
                iVar3 = rn2(shp._4_4_);
                if (iVar3 != 0) goto LAB_002d1d77;
              }
              else {
                shp._4_4_ = 1;
              }
              cost_of_damage = (long)appear_here;
              local_a0 = dist2((int)(appear_here->place).x,(int)(appear_here->place).y,(int)u.ux,
                               (int)u.uy);
              picks = uVar4;
              pmStack_20 = mtmp;
            }
          }
        }
LAB_002d1d77:
      }
    }
    appear_here = appear_here->next;
  }
  if (_nearest_damage == 0) {
    return;
  }
  if (pmStack_20 == (monst *)0x0) {
    return;
  }
  cVar2 = *(char *)(cost_of_damage + 0x18);
  y_00 = *(char *)(cost_of_damage + 0x19);
  strncpy(&pmStack_20[0x1b].field_0x75,plname,0x20);
  if (((*(uint *)&pmStack_20->field_0x60 >> 0x16 & 1) == 0) ||
     (*(char *)((long)&pmStack_20[0x1b].meating + 1) != '\0')) {
    hot_pursuit(pmStack_20);
    return;
  }
  pcVar5 = in_rooms(level,pmStack_20->mx,pmStack_20->my,0x12);
  if (*pcVar5 == '\0') {
    if ((viz_array[pmStack_20->my][pmStack_20->mx] & 2U) == 0) {
      return;
    }
  }
  else {
    if (qbuf[0x4a] == '\0') {
      if (((level->monsters[cVar2][y_00] != (monst *)0x0) &&
          ((*(uint *)&level->monsters[cVar2][y_00]->field_0x60 >> 9 & 1) == 0)) &&
         (flags.soundok != '\0')) {
        You_hear("an angry voice:");
        verbalize("Out of my way, scum!");
      }
      mnearto(pmStack_20,cVar2,y_00,'\x01');
    }
    else {
      bVar1 = um_dist(pmStack_20->mx,pmStack_20->my,'\x01');
      if ((bVar1 != '\0') && (bVar1 = um_dist(pmStack_20->mx,pmStack_20->my,'\x03'), bVar1 == '\0'))
      {
        pcVar5 = shkname(pmStack_20);
        pline("%s leaps towards you!",pcVar5);
        mnexto(pmStack_20);
      }
      bVar1 = um_dist(pmStack_20->mx,pmStack_20->my,'\x01');
      if (bVar1 != '\0') goto LAB_002d208f;
    }
    bVar1 = um_dist(cVar2,y_00,'\x01');
    if (((bVar1 == '\0') || (qbuf[0x4a] != '\0')) &&
       ((cant_mollify == '\0' &&
        ((lVar6 = money_cnt(invent), _nearest_damage <= lVar6 + (int)pmStack_20[0x1b].mappearance &&
         (iVar3 = rn2(0x32), iVar3 != 0)))))) {
      if (((u.uprops[0xd].intrinsic != 0) ||
          (((u.uprops[0xd].extrinsic != 0 || (youmonst.data == mons + 0x9e)) ||
           (youmonst.data == mons + 0x7b)))) && (u.uprops[0xd].blocked == 0)) {
        pcVar5 = shkname(pmStack_20);
        pline("Your invisibility does not fool %s!",pcVar5);
      }
      pcVar5 = currency(_nearest_damage);
      sprintf(local_78,"\"Cad!  You did %ld %s worth of damage!\"  Pay? ",_nearest_damage,pcVar5);
      cVar2 = yn_function(local_78,"yn",'n');
      if (cVar2 != 'n') {
        lVar6 = check_credit(_nearest_damage,pmStack_20);
        money2mon(pmStack_20,lVar6);
        iflags.botl = '\x01';
        shkname(pmStack_20);
        pline("Mollified, %s accepts your restitution.");
        home_shk(pmStack_20,'\0');
        pacify_shk(pmStack_20);
        return;
      }
      verbalize("Oh, yes!  You\'ll pay!");
      hot_pursuit(pmStack_20);
      iVar3 = sgn((int)u.ualign.type);
      adjalign(-iVar3);
      return;
    }
    bVar1 = um_dist(cVar2,y_00,'\x01');
    if ((bVar1 != '\0') && (qbuf[0x4a] == '\0')) {
      pcVar5 = shkname(pmStack_20);
      pline("%s shouts:",pcVar5);
      pcVar5 = "door";
      if (bVar7) {
        pcVar5 = "shop";
      }
      verbalize("Who dared %s my %s?",dmgstr,pcVar5);
      goto LAB_002d20ba;
    }
  }
LAB_002d208f:
  pcVar5 = "door";
  if (bVar7) {
    pcVar5 = "shop";
  }
  verbalize("How dare you %s my %s?",dmgstr,pcVar5);
LAB_002d20ba:
  hot_pursuit(pmStack_20);
  return;
}

Assistant:

void pay_for_damage(const char *dmgstr, boolean cant_mollify)
{
	struct monst *shkp = NULL;
	char shops_affected[5];
	boolean uinshp = (*u.ushops != '\0');
	char qbuf[80];
	xchar x, y;
	boolean dugwall = !strcmp(dmgstr, "dig into") ||	/* wand */
			  !strcmp(dmgstr, "damage");		/* pick-axe */
	struct damage *tmp_dam, *appear_here = 0;
	/* any number >= (80*80)+(24*24) would do, actually */
	long cost_of_damage = 0L;
	unsigned int nearest_shk = 7000, nearest_damage = 7000;
	int picks = 0;

	for (tmp_dam = level->damagelist;
	     (tmp_dam && (tmp_dam->when == moves));
	     tmp_dam = tmp_dam->next) {
	    char *shp;

	    if (!tmp_dam->cost)
		continue;
	    cost_of_damage += tmp_dam->cost;
	    strcpy(shops_affected,
		   in_rooms(level, tmp_dam->place.x, tmp_dam->place.y, SHOPBASE));
	    for (shp = shops_affected; *shp; shp++) {
		struct monst *tmp_shk;
		unsigned int shk_distance;

		if (!(tmp_shk = shop_keeper(level, *shp)))
		    continue;
		if (tmp_shk == shkp) {
		    unsigned int damage_distance =
				   distu(tmp_dam->place.x, tmp_dam->place.y);

		    if (damage_distance < nearest_damage) {
			nearest_damage = damage_distance;
			appear_here = tmp_dam;
		    }
		    continue;
		}
		if (!inhishop(tmp_shk))
		    continue;
		shk_distance = distu(tmp_shk->mx, tmp_shk->my);
		if (shk_distance > nearest_shk)
		    continue;
		if ((shk_distance == nearest_shk) && picks) {
		    if (rn2(++picks))
			continue;
		} else
		    picks = 1;
		shkp = tmp_shk;
		nearest_shk = shk_distance;
		appear_here = tmp_dam;
		nearest_damage = distu(tmp_dam->place.x, tmp_dam->place.y);
	    }
	}

	if (!cost_of_damage || !shkp)
	    return;

	x = appear_here->place.x;
	y = appear_here->place.y;

	/* not the best introduction to the shk... */
	strncpy(ESHK(shkp)->customer,plname,PL_NSIZ);

	/* if the shk is already on the war path, be sure it's all out */
	if (ANGRY(shkp) || ESHK(shkp)->following) {
		hot_pursuit(shkp);
		return;
	}

	/* if the shk is not in their shop.. */
	if (!*in_rooms(level, shkp->mx,shkp->my,SHOPBASE)) {
		if (!cansee(shkp->mx, shkp->my))
			return;
		goto getcad;
	}

	if (uinshp) {
		if (um_dist(shkp->mx, shkp->my, 1) &&
			!um_dist(shkp->mx, shkp->my, 3)) {
		    pline("%s leaps towards you!", shkname(shkp));
		    mnexto(shkp);
		}
		if (um_dist(shkp->mx, shkp->my, 1)) goto getcad;
	} else {
	    /*
	     * Make shkp show up at the door.  Effect:  If there is a monster
	     * in the doorway, have the hero hear the shopkeeper yell a bit,
	     * pause, then have the shopkeeper appear at the door, having
	     * yanked the hapless critter out of the way.
	     */
	    if (MON_AT(level, x, y)) {
		if (flags.soundok) {
		    You_hear("an angry voice:");
		    verbalize("Out of my way, scum!");
		}
	    }
	    mnearto(shkp, x, y, TRUE);
	}

	if ((um_dist(x, y, 1) && !uinshp) || cant_mollify ||
	   (money_cnt(invent) + ESHK(shkp)->credit) < cost_of_damage || !rn2(50)) {
		if (um_dist(x, y, 1) && !uinshp) {
		    pline("%s shouts:", shkname(shkp));
		    verbalize("Who dared %s my %s?", dmgstr,
					 dugwall ? "shop" : "door");
		} else {
getcad:
		    verbalize("How dare you %s my %s?", dmgstr,
					 dugwall ? "shop" : "door");
		}
		hot_pursuit(shkp);
		return;
	}

	if (Invis) pline("Your invisibility does not fool %s!", shkname(shkp));
	sprintf(qbuf,"\"Cad!  You did %ld %s worth of damage!\"  Pay? ",
		 cost_of_damage, currency(cost_of_damage));
	if (yn(qbuf) != 'n') {
		cost_of_damage = check_credit(cost_of_damage, shkp);
                money2mon(shkp, cost_of_damage);
		iflags.botl = 1;
		pline("Mollified, %s accepts your restitution.",
			shkname(shkp));
		/* move shk back to his home loc */
		home_shk(shkp, FALSE);
		pacify_shk(shkp);
	} else {
		verbalize("Oh, yes!  You'll pay!");
		hot_pursuit(shkp);
		adjalign(-sgn(u.ualign.type));
	}
}